

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amha_star.hpp
# Opt level: O3

bool __thiscall
csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
improvePath(AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            *this)

{
  double *pdVar1;
  int *piVar2;
  iterator __position;
  pointer pHVar3;
  ostream *poVar4;
  long lVar5;
  mapped_type *pmVar6;
  bool bVar7;
  char *pcVar8;
  long lVar9;
  double dVar10;
  element_type *peVar11;
  SearchVertexPtr least_cost_vertex;
  Heap<double> local_68;
  Heap<double> local_50;
  _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_38;
  
  local_68.data_.
  super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_68.data_.
                        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  __position._M_current =
       (this->anytime_stats_).num_expansions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->anytime_stats_).num_expansions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&(this->anytime_stats_).num_expansions_,__position,(int *)&local_68);
  }
  else {
    *__position._M_current = 0;
    (this->anytime_stats_).num_expansions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[AMHAStar::improvePath] Improve path iteration: ",0x30);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  local_50.data_.
  super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this->closed_inad_;
  local_38 = (_Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&(this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 ).closed_;
  while( true ) {
    csbpl_common::Heap<double>::top(&local_68);
    peVar11 = ((local_68.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.data_.
        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_68.data_.
                 super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((double)peVar11 == INFINITY) break;
    lVar5 = std::chrono::_V2::system_clock::now();
    dVar10 = (double)(lVar5 - (this->
                              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                              ).params_.start_time_.__d.__r) / 1000000000.0;
    pdVar1 = &(this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).params_.time_limit_;
    if (*pdVar1 <= dVar10 && dVar10 != *pdVar1) {
      pcVar8 = "[AMHAStar::improvePath] Time limit exceeded... Exiting!";
      lVar5 = 0x37;
LAB_00104b39:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar5);
      bVar7 = false;
LAB_00104aba:
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      return bVar7;
    }
    if (0 < (this->
            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            ).params_.num_inad_) {
      lVar5 = 0;
      lVar9 = 0;
      do {
        pHVar3 = (this->open_inad_).
                 super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((int)((ulong)(*(long *)((long)&(pHVar3->data_).
                                           super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish + lVar5) -
                         *(long *)((long)&(pHVar3->data_).
                                          super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar5)) >> 4)
            < 1) {
LAB_001048c2:
          dVar10 = ((this->
                    super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                    ).goal_vertex_.
                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->g_cost_;
          csbpl_common::Heap<double>::top(&local_68);
          peVar11 = ((local_68.data_.
                      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_68.data_.
              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_68.data_.
            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)peVar11;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_68.data_.
                       super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            peVar11 = (element_type *)
                      local_68.data_.
                      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          if (dVar10 < (double)peVar11) {
LAB_00104aa0:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "[AMHAStar::improvePath] Goal node expanded. Premature termiation!",0x41);
            bVar7 = true;
            goto LAB_00104aba;
          }
          csbpl_common::Heap<double>::top(&local_50);
          local_68.data_.
          super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_50.data_.
               super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_68.data_.
          super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_50.data_.
               super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_50.data_.
              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)
               ((long)local_50.data_.
                      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8) =
                   *(_Atomic_word *)
                    ((long)local_50.data_.
                           super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
              UNLOCK();
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_50.data_.
                  super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001049e2;
            }
            else {
              *(_Atomic_word *)
               ((long)local_50.data_.
                      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8) =
                   *(_Atomic_word *)
                    ((long)local_50.data_.
                           super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_50.data_.
                       super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
LAB_001049e2:
          (*(this->
            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            )._vptr_Dijkstra[3])(this,&local_68);
          pmVar6 = std::__detail::
                   _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](local_38,(key_type *)
                                         (local_68.data_.
                                          super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        else {
          csbpl_common::Heap<double>::top(&local_68);
          local_68.data_.
          super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((local_68.data_.
                          super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
          dVar10 = (this->
                   super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                   ).params_.mha_eps_;
          csbpl_common::Heap<double>::top(&local_50);
          peVar11 = ((local_50.data_.
                      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_50.data_.
              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_50.data_.
                       super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_68.data_.
              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_68.data_.
                       super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          if (dVar10 * (double)peVar11 <
              (double)local_68.data_.
                      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_001048c2;
          dVar10 = ((this->
                    super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                    ).goal_vertex_.
                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->g_cost_;
          csbpl_common::Heap<double>::top(&local_68);
          peVar11 = ((local_68.data_.
                      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_68.data_.
              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_68.data_.
            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)peVar11;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_68.data_.
                       super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            peVar11 = (element_type *)
                      local_68.data_.
                      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          if (dVar10 < (double)peVar11) goto LAB_00104aa0;
          csbpl_common::Heap<double>::top(&local_50);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_50.data_.
              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)
               ((long)local_50.data_.
                      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8) =
                   *(_Atomic_word *)
                    ((long)local_50.data_.
                           super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)
               ((long)local_50.data_.
                      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8) =
                   *(_Atomic_word *)
                    ((long)local_50.data_.
                           super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
            }
          }
          local_68.data_.
          super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)local_50.data_.
                        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[4].
                        super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_68.data_.
          super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)local_50.data_.
                        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[5].
                        super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_68.data_.
              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_68.data_.
              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_68.data_.
                   super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_68.data_.
              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_68.data_.
                   super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_50.data_.
              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_50.data_.
                       super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_50.data_.
              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_50.data_.
                       super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          (*(this->
            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            )._vptr_Dijkstra[3])(this,&local_68);
          pmVar6 = std::__detail::
                   _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)local_50.data_.
                                   super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (key_type *)
                                (local_68.data_.
                                 super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        *pmVar6 = true;
        piVar2 = (this->anytime_stats_).num_expansions_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish + -1;
        *piVar2 = *piVar2 + 1;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_68.data_.
            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_68.data_.
                     super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        lVar9 = lVar9 + 1;
        lVar5 = lVar5 + 0x18;
      } while (lVar9 < (this->
                       super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                       ).params_.num_inad_);
    }
  }
  if ((int)((ulong)((long)(this->
                          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                          ).open_.data_.
                          super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->
                         super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                         ).open_.data_.
                         super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) != 0) {
    return true;
  }
  pcVar8 = "[AMHAStar::improvePath] Open list is empty! Error... ";
  lVar5 = 0x35;
  goto LAB_00104b39;
}

Assistant:

virtual bool improvePath()
    {
#if DEBUG
      int num_expansions = 0;
  double nearest_node_to_goal_dist = std::numeric_limits<double>::infinity();
  SearchVertexPtr nearest_node_to_goal;
#endif
      this->anytime_stats_.num_expansions_.push_back(0);
      std::cout << "[AMHAStar::improvePath] Improve path iteration: "
                << this->anytime_stats_.num_expansions_.size() << std::endl;
      while (this->open_.top()->key_ < std::numeric_limits<double>::infinity())
      {
        
        double time_elapsed =
          duration_cast<duration<double> >(Clock::now() -
                                           this->params_.start_time_).count();
        
        if (time_elapsed > this->params_.time_limit_)
        {
          std::cout << "[AMHAStar::improvePath] Time limit exceeded..."
                       " Exiting!" << std::endl;
          return false;
        }
        
        for (int i=0; i<this->params_.num_inad_; ++i)
        {
          if (open_inad_[i].size() > 0 &&
              open_inad_[i].top()->key_ <= this->params_.mha_eps_*this->open_.top()->key_)
          {
            if (this->goal_vertex_->g_cost_ < open_inad_[i].top()->key_)
            {
              std::cout << "[AMHAStar::improvePath] Goal node expanded. "
                           "Premature termiation!" << std::endl;
              return true;
            }
            else
            {
              SearchVertexPtr least_cost_vertex =
                std::static_pointer_cast<SearchVertex>(open_inad_[i].top())->self_ptr_;
              expand(least_cost_vertex);
              closed_inad_[least_cost_vertex->state_] = true;
              ++this->anytime_stats_.num_expansions_.back();
#if DEBUG
              ++num_expansions;
#endif
            }
          }
          else
          {
            if (this->goal_vertex_->g_cost_ < this->open_.top()->key_)
            {
              std::cout << "[AMHAStar::improvePath] Goal node expanded. "
                           "Premature termiation!" << std::endl;
              return true;
            }
            else
            {
              SearchVertexPtr least_cost_vertex =
                std::static_pointer_cast<SearchVertex>(this->open_.top());
              expand(least_cost_vertex);
              this->closed_[least_cost_vertex->state_] = true;
              ++this->anytime_stats_.num_expansions_.back();
#if DEBUG
              ++num_expansions;
#endif
            }
          }
        }
      }

#if DEBUG
      std::cout << "[AMHAStar::improvePath] Total number of expansions: "
                << num_expansions << std::endl;
#endif
      
      
      if (this->open_.size() == 0)
      {
#if DEBUG
        std::cout << "[AMHAStar::improvePath] Open list is empty! Error... "
                     "Returning nearest node reached" << std::endl;
        this->env_ptr_->goal_ = nearest_node_to_goal->state_;
        return true;
#endif
        std::cout << "[AMHAStar::improvePath] Open list is empty! Error... " << std::endl;
        return false;
      }
      
      return true;
    }